

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

Read<signed_char>
Omega_h::inertia::anon_unknown_0::mark_bisection_internal
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis,Vector<3> center,
          Real total_mass)

{
  int *piVar1;
  Vector<3> axis_00;
  Alloc *pAVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar6;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  ostream *extraout_RAX_01;
  ostream *extraout_RAX_02;
  ostream *poVar4;
  Alloc *pAVar5;
  Alloc *extraout_RAX_03;
  ulong *in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *pvVar7;
  void *extraout_RDX_08;
  uint uVar8;
  ulong uVar9;
  Read<signed_char> RVar10;
  Reals dists;
  Vector<3> axis2;
  Reals local_100;
  Reals *local_f0;
  Real local_e8;
  Real local_e0;
  Reals local_d8;
  Reals local_c8;
  CommPtr local_b8;
  Alloc *local_a8;
  void *local_a0;
  Reals local_98;
  CommPtr local_88;
  Reals local_78;
  double local_68 [3];
  Reals local_50;
  Alloc *local_40;
  void *local_38;
  
  local_40 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pAVar2 = local_40;
  local_38 = (masses->write_).shared_alloc_.direct_ptr;
  local_e8 = tolerance;
  local_e0 = total_mass;
  get_distances(&local_100,center,axis);
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(coords->write_).shared_alloc_.alloc;
  local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr;
  if (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.alloc = local_100.write_.shared_alloc_.alloc;
  if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_100.write_.shared_alloc_.alloc)->use_count =
           (local_100.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  local_98.write_.shared_alloc_.direct_ptr = local_100.write_.shared_alloc_.direct_ptr;
  local_50.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar5 = local_50.write_.shared_alloc_.alloc;
  local_50.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
  local_f0 = &local_100;
  bVar3 = mark_axis_bisection(&local_88,&local_98,&local_50,local_e0,local_e8,
                              (Read<signed_char> *)comm);
  pvVar7 = extraout_RDX;
  uVar6 = extraout_var;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
      pvVar7 = extraout_RDX_00;
      uVar6 = extraout_var_00;
    }
  }
  poVar4 = (ostream *)CONCAT71(uVar6,pAVar2 == (Alloc *)0x0);
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      poVar4 = extraout_RAX;
      pvVar7 = extraout_RDX_01;
    }
  }
  if (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    poVar4 = extraout_RAX_00;
    pvVar7 = extraout_RDX_02;
  }
  if (!bVar3) {
    uVar9 = 0;
    do {
      local_68[2] = axis.super_Few<double,_3>.array_[2];
      local_68[0] = axis.super_Few<double,_3>.array_[0];
      local_68[1] = axis.super_Few<double,_3>.array_[1];
      local_68[uVar9 >> 1] =
           *(double *)(&DAT_00449510 + (ulong)((uVar9 & 1) == 0) * 8) + local_68[uVar9 >> 1];
      local_a8 = (masses->write_).shared_alloc_.alloc;
      if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a8 = (Alloc *)(local_a8->size * 8 + 1);
        }
        else {
          local_a8->use_count = local_a8->use_count + 1;
        }
      }
      pAVar5 = local_a8;
      local_a0 = (masses->write_).shared_alloc_.direct_ptr;
      axis_00.super_Few<double,_3>.array_[1] = local_68[1];
      axis_00.super_Few<double,_3>.array_[0] = local_68[0];
      axis_00.super_Few<double,_3>.array_[2] = local_68[2];
      get_distances(&local_78,center,axis_00);
      pAVar2 = local_100.write_.shared_alloc_.alloc;
      if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
          local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      local_100.write_.shared_alloc_.alloc = local_78.write_.shared_alloc_.alloc;
      local_100.write_.shared_alloc_.direct_ptr = local_78.write_.shared_alloc_.direct_ptr;
      if ((((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
           local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + -1;
        local_100.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_78.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_78.write_.shared_alloc_.direct_ptr = (void *)0x0;
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar1 = &pAVar5->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(coords->write_).shared_alloc_.alloc;
      local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr
      ;
      if (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_c8.write_.shared_alloc_.alloc = local_100.write_.shared_alloc_.alloc;
      if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
          local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c8.write_.shared_alloc_.alloc =
               (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_100.write_.shared_alloc_.alloc)->use_count =
               (local_100.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pAVar2 = local_c8.write_.shared_alloc_.alloc;
      local_c8.write_.shared_alloc_.direct_ptr = local_100.write_.shared_alloc_.direct_ptr;
      local_d8.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
      if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d8.write_.shared_alloc_.alloc =
               (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_d8.write_.shared_alloc_.alloc)->use_count =
               (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pAVar5 = local_d8.write_.shared_alloc_.alloc;
      local_d8.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
      bVar3 = mark_axis_bisection(&local_b8,&local_c8,&local_d8,local_e0,local_e8,
                                  (Read<signed_char> *)comm);
      pvVar7 = extraout_RDX_03;
      uVar6 = extraout_var_01;
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar1 = &pAVar5->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
          pvVar7 = extraout_RDX_04;
          uVar6 = extraout_var_02;
        }
      }
      poVar4 = (ostream *)CONCAT71(uVar6,pAVar2 == (Alloc *)0x0);
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        piVar1 = &pAVar2->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar2);
          operator_delete(pAVar2,0x48);
          poVar4 = extraout_RAX_01;
          pvVar7 = extraout_RDX_05;
        }
      }
      if (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        poVar4 = extraout_RAX_02;
        pvVar7 = extraout_RDX_06;
      }
      if (bVar3) goto LAB_002e756a;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,"Omega_h WARNING: no good inertial bisection\n",0x2c);
    pvVar7 = extraout_RDX_07;
  }
LAB_002e756a:
  pAVar2 = local_100.write_.shared_alloc_.alloc;
  pAVar5 = (Alloc *)CONCAT71((int7)((ulong)poVar4 >> 8),
                             local_100.write_.shared_alloc_.alloc == (Alloc *)0x0);
  if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pAVar5 = extraout_RAX_03;
      pvVar7 = extraout_RDX_08;
    }
  }
  RVar10.write_.shared_alloc_.direct_ptr = pvVar7;
  RVar10.write_.shared_alloc_.alloc = pAVar5;
  return (Read<signed_char>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection_internal(CommPtr comm, Reals coords, Reals masses,
    Real tolerance, Vector<3> axis, Vector<3> center, Real total_mass) {
  auto dists = get_distances(coords, center, axis);
  Read<I8> marked;
  if (mark_axis_bisection(comm, dists, masses, total_mass, tolerance, marked)) {
    return marked;
  }
  // if we couldn't find a decent cutting plane, this may be a highly
  // structured mesh with many points coincident on the cutting plane.
  // perturb the axis vector to escape this scenario
  for (Int i = 0; i < 3 * 2; ++i) {
    auto axis2 = axis;
    axis2[i / 2] += (i % 2) ? 1e-3 : -1e-3;
    dists = get_distances(coords, center, axis2);
    if (mark_axis_bisection(
            comm, dists, masses, total_mass, tolerance, marked)) {
      return marked;
    }
  }
  // even perturbation of the axis could not find a good
  // cutting plane. warn the user of this failure, but continue
  // with the axis that we have, because the cutting plane
  // is still the best we could find.
  // (to date I have not seen this happen, even with > 1 billion elements)
  std::cerr << "Omega_h WARNING: no good inertial bisection\n";
  return marked;
}